

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall
Assimp::FBXExporter::WriteAnimationCurve
          (FBXExporter *this,StreamWriterLE *outstream,double default_value,
          vector<long,_std::allocator<long>_> *times,vector<float,_std::allocator<float>_> *values,
          int64_t curvenode_uid,string *property_link)

{
  long value;
  initializer_list<int> __l;
  initializer_list<float> __l_00;
  initializer_list<int> __l_01;
  allocator_type local_18a;
  allocator<char> local_189;
  string local_188;
  undefined8 local_168;
  undefined8 uStack_160;
  double local_150;
  int64_t curve_uid;
  int64_t curvenode_uid_local;
  _Vector_base<int,_std::allocator<int>_> local_138;
  _Vector_base<float,_std::allocator<float>_> local_120;
  _Vector_base<int,_std::allocator<int>_> local_108;
  _Vector_base<float,_std::allocator<float>_> local_f0;
  _Vector_base<long,_std::allocator<long>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Node n;
  
  local_150 = default_value;
  curvenode_uid_local = curvenode_uid;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"AnimationCurve",(allocator<char> *)&local_168);
  FBX::Node::Node(&n,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  value = this->last_uid + 1;
  this->last_uid = value;
  curve_uid = value;
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FBX::SEPARATOR_abi_cxx11_,"AnimCurve");
  FBX::Node::AddProperties<long,std::__cxx11::string,char_const*>(&n,value,&local_c0,"");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"Default",(allocator<char> *)&local_168);
  FBX::Node::AddChild<double>(&n,&local_188,local_150);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"KeyVer",(allocator<char> *)&local_168);
  FBX::Node::AddChild<int>(&n,&local_188,0xfa9);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"KeyTime",(allocator<char> *)&local_168);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_d8,times);
  FBX::Node::AddChild<std::vector<long,std::allocator<long>>>
            (&n,&local_188,(vector<long,_std::allocator<long>_> *)&local_d8);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_d8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"KeyValueFloat",(allocator<char> *)&local_168);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_f0,values);
  FBX::Node::AddChild<std::vector<float,std::allocator<float>>>
            (&n,&local_188,(vector<float,_std::allocator<float>_> *)&local_f0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_f0);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"KeyAttrFlags",&local_189)
  ;
  local_168 = (ulong)local_168._4_4_ << 0x20;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_168;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_108,__l,&local_18a);
  FBX::Node::AddChild<std::vector<int,std::allocator<int>>>
            (&n,&local_188,(vector<int,_std::allocator<int>_> *)&local_108);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"KeyAttrDataFloat",&local_189);
  local_168 = 0;
  uStack_160 = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_168;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_120,__l_00,(allocator_type *)&local_18a
            );
  FBX::Node::AddChild<std::vector<float,std::allocator<float>>>
            (&n,&local_188,(vector<float,_std::allocator<float>_> *)&local_120);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_120);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"KeyAttrRefCount",&local_189);
  local_168 = CONCAT44(local_168._4_4_,
                       (int)((ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                          _M_impl.super__Vector_impl_data._M_start) >> 3));
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_168;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_138,__l_01,&local_18a);
  FBX::Node::AddChild<std::vector<int,std::allocator<int>>>
            (&n,&local_188,(vector<int,_std::allocator<int>_> *)&local_138);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_138);
  std::__cxx11::string::~string((string *)&local_188);
  FBX::Node::Dump(&n,outstream,this->binary,1);
  std::vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>>::
  emplace_back<char_const(&)[2],char_const(&)[3],long&,long&,std::__cxx11::string_const&>
            ((vector<Assimp::FBX::Node,std::allocator<Assimp::FBX::Node>> *)&this->connections,
             (char (*) [2])0x5c8419,(char (*) [3])"OP",&curve_uid,&curvenode_uid_local,property_link
            );
  FBX::Node::~Node(&n);
  return;
}

Assistant:

void FBXExporter::WriteAnimationCurve(
    StreamWriterLE& outstream,
    double default_value,
    const std::vector<int64_t>& times,
    const std::vector<float>& values,
    int64_t curvenode_uid,
    const std::string& property_link // "d|X", "d|Y", etc
) {
    FBX::Node n("AnimationCurve");
    int64_t curve_uid = generate_uid();
    n.AddProperties(curve_uid, FBX::SEPARATOR + "AnimCurve", "");
    n.AddChild("Default", default_value);
    n.AddChild("KeyVer", int32_t(4009));
    n.AddChild("KeyTime", times);
    n.AddChild("KeyValueFloat", values);
    // TODO: keyattr flags and data (STUB for now)
    n.AddChild("KeyAttrFlags", std::vector<int32_t>{0});
    n.AddChild("KeyAttrDataFloat", std::vector<float>{0,0,0,0});
    n.AddChild(
        "KeyAttrRefCount",
        std::vector<int32_t>{static_cast<int32_t>(times.size())}
    );
    n.Dump(outstream, binary, 1);
    this->connections.emplace_back(
        "C", "OP", curve_uid, curvenode_uid, property_link
    );
}